

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

StringPtr kj::operator*(uint param_1)

{
  char *__s;
  size_t sVar1;
  StringPtr SVar2;
  Fault f;
  uint index;
  DebugComparison<unsigned_int_&,_unsigned_long> _kjCondition;
  
  _kjCondition.left = &index;
  _kjCondition.right = 0x1a;
  _kjCondition.op.content.ptr = " < ";
  _kjCondition.op.content.size_ = 4;
  _kjCondition.result = param_1 < 0x1a;
  index = param_1;
  if (_kjCondition.result) {
    __s = *(char **)(METHOD_NAMES + (ulong)param_1 * 8);
    sVar1 = strlen(__s);
    SVar2.content.size_ = sVar1 + 1;
    SVar2.content.ptr = __s;
    return (StringPtr)SVar2.content;
  }
  _::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_long>&,char_const(&)[20]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x155,FAILED,"index < size(METHOD_NAMES)","_kjCondition,\"invalid HTTP method\"",
             &_kjCondition,(char (*) [20])"invalid HTTP method");
  _::Debug::Fault::fatal(&f);
}

Assistant:

kj::StringPtr KJ_STRINGIFY(HttpMethod method) {
  auto index = static_cast<uint>(method);
  KJ_ASSERT(index < size(METHOD_NAMES), "invalid HTTP method");

  return METHOD_NAMES[index];
}